

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray *
xxflate(ZLibOp op,QArrayDataPointer<char> *out,QByteArrayView input,
       function_ref<int_(z_stream_s_*)_const> init,
       function_ref<int_(z_stream_s_*,_unsigned_long)_const> processChunk,
       function_ref<void_(z_stream_s_*)_const> deinit)

{
  int iVar1;
  char *pcVar2;
  QArrayDataPointer<char> *this;
  QArrayDataPointer<char> *in_RDX;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  qsizetype avail_out;
  int res;
  size_t inputLeft;
  unsigned_long MaxStatisticsSize;
  uint MaxChunkSize;
  int err;
  qsizetype initalSize;
  qsizetype capacity;
  z_stream zs;
  QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_text_qbytearray_cpp:623:33)>
  sg;
  undefined7 in_stack_fffffffffffffe98;
  ZLibOp in_stack_fffffffffffffe9f;
  QArrayDataPointer<char> *in_stack_fffffffffffffea0;
  z_stream_s *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  uint in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffebc;
  QArrayDataPointer<char> *old;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  GrowthPosition in_stack_fffffffffffffefc;
  ulong local_f0;
  long local_d0;
  const_pointer local_a0;
  uint local_98;
  char *local_88;
  uint local_80;
  QByteArrayView local_30;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  old = (QArrayDataPointer<char> *)&stack0x00000008;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = QArrayDataPointer<char>::data(in_RDX);
  if (pcVar2 == (char *)0x0) {
    tooMuchData(in_stack_fffffffffffffe9f);
  }
  else {
    local_d0 = QArrayDataPointer<char>::allocatedCapacity(in_stack_fffffffffffffea0);
    memset(&local_a0,0,0x70);
    local_a0 = QByteArrayView::data(&local_30);
    iVar1 = qxp::detail::function_ref_base<false,_const_void,_int,_z_stream_s_*>::operator()
                      ((function_ref_base<false,_const_void,_int,_z_stream_s_*> *)
                       CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                       in_stack_fffffffffffffea8);
    if (iVar1 == 0) {
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      qScopeGuard<xxflate(ZLibOp,QArrayDataPointer<char>,QByteArrayView,qxp::function_ref<int(z_stream_s*)const>,qxp::function_ref<int(z_stream_s*,unsigned_long)const>,qxp::function_ref<void(z_stream_s*)const>)::__0>
                ((anon_class_16_2_1f711a61_for_m_func *)
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      local_f0 = QByteArrayView::size(&local_30);
      do {
        if (local_80 == 0) {
          this = (QArrayDataPointer<char> *)(local_d0 - in_RDX->size);
          if (this == (QArrayDataPointer<char> *)0x0) {
            QArrayDataPointer<char>::operator->(in_RDX);
            QArrayDataPointer<char>::reallocateAndGrow
                      (this,in_stack_fffffffffffffefc,
                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),old);
            pcVar2 = QArrayDataPointer<char>::data(in_RDX);
            if (pcVar2 == (char *)0x0) {
              tooMuchData(in_stack_fffffffffffffe9f);
              goto LAB_004b2e8b;
            }
            local_d0 = QArrayDataPointer<char>::allocatedCapacity(in_stack_fffffffffffffea0);
            this = (QArrayDataPointer<char> *)(local_d0 - in_RDX->size);
          }
          local_88 = QArrayDataPointer<char>::data(in_RDX);
          local_88 = local_88 + in_RDX->size;
          if (this < (QArrayDataPointer<char> *)0x100000000) {
            in_stack_fffffffffffffebc = (uint)this;
          }
          else {
            in_stack_fffffffffffffebc = 0xffffffff;
          }
          in_RDX->size = (ulong)in_stack_fffffffffffffebc + in_RDX->size;
          local_80 = in_stack_fffffffffffffebc;
        }
        if (local_98 == 0) {
          if (local_f0 < 0x100000000) {
            in_stack_fffffffffffffeb8 = (uint)local_f0;
          }
          else {
            in_stack_fffffffffffffeb8 = 0xffffffff;
          }
          local_f0 = local_f0 - in_stack_fffffffffffffeb8;
          local_98 = in_stack_fffffffffffffeb8;
        }
        in_stack_fffffffffffffeb4 =
             qxp::detail::function_ref_base<false,_const_void,_int,_z_stream_s_*,_unsigned_long>::
             operator()((function_ref_base<false,_const_void,_int,_z_stream_s_*,_unsigned_long> *)
                        in_stack_fffffffffffffea0,
                        (z_stream_s *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                        CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      } while (in_stack_fffffffffffffeb4 == 0);
      switch(in_stack_fffffffffffffeb4) {
      case 1:
        in_RDX->size = in_RDX->size - (ulong)local_80;
        pcVar2 = QArrayDataPointer<char>::data(in_RDX);
        pcVar2[in_RDX->size] = '\0';
        QByteArray::QByteArray
                  ((QByteArray *)in_stack_fffffffffffffea0,
                   (DataPointer *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
        break;
      case -5:
      case -3:
        invalidCompressedData();
        break;
      case -4:
        tooMuchData(in_stack_fffffffffffffe9f);
        break;
      default:
        unexpectedZlibError((ZLibOp)((ulong)in_RDX >> 0x38),(int)in_RDX,
                            (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      }
LAB_004b2e8b:
      QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/text/qbytearray.cpp:623:33)>
      ::~QScopeGuard((QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_text_qbytearray_cpp:623:33)>
                      *)in_stack_fffffffffffffea0);
    }
    else {
      unexpectedZlibError((ZLibOp)((ulong)in_RDX >> 0x38),(int)in_RDX,
                          (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray xxflate(ZLibOp op, QArrayDataPointer<char> out, QByteArrayView input,
                          qxp::function_ref<int(z_stream *) const> init,
                          qxp::function_ref<int(z_stream *, size_t) const> processChunk,
                          qxp::function_ref<void(z_stream *) const> deinit)
{
    if (out.data() == nullptr) // allocation failed
        return tooMuchData(op);
    qsizetype capacity = out.allocatedCapacity();

    const auto initalSize = out.size;

    z_stream zs = {};
    zs.next_in = reinterpret_cast<uchar *>(const_cast<char *>(input.data())); // 1980s C API...
    if (const int err = init(&zs); err != Z_OK)
        return unexpectedZlibError(op, err, zs.msg);
    const auto sg = qScopeGuard([&] { deinit(&zs); });

    using ZlibChunkSize_t = decltype(zs.avail_in);
    static_assert(!std::is_signed_v<ZlibChunkSize_t>);
    static_assert(std::is_same_v<ZlibChunkSize_t, decltype(zs.avail_out)>);
    constexpr auto MaxChunkSize = std::numeric_limits<ZlibChunkSize_t>::max();
    [[maybe_unused]]
    constexpr auto MaxStatisticsSize = std::numeric_limits<decltype(zs.total_out)>::max();

    size_t inputLeft = size_t(input.size());

    int res;
    do {
        Q_ASSERT(out.freeSpaceAtBegin() == 0); // ensure prepend optimization stays out of the way
        Q_ASSERT(capacity == out.allocatedCapacity());

        if (zs.avail_out == 0) {
            Q_ASSERT(size_t(out.size) - initalSize > MaxStatisticsSize || // total_out overflow
                     size_t(out.size) - initalSize == zs.total_out);
            Q_ASSERT(out.size <= capacity);

            qsizetype avail_out = capacity - out.size;
            if (avail_out == 0) {
                out->reallocateAndGrow(QArrayData::GrowsAtEnd, 1); // grow to next natural capacity
                if (out.data() == nullptr) // reallocation failed
                    return tooMuchData(op);
                capacity = out.allocatedCapacity();
                avail_out = capacity - out.size;
            }
            zs.next_out = reinterpret_cast<uchar *>(out.data()) + out.size;
            zs.avail_out = size_t(avail_out) > size_t(MaxChunkSize) ? MaxChunkSize
                                                                    : ZlibChunkSize_t(avail_out);
            out.size += zs.avail_out;

            Q_ASSERT(zs.avail_out > 0);
        }

        if (zs.avail_in == 0) {
            // zs.next_in is kept up-to-date by processChunk(), so nothing to do
            zs.avail_in = inputLeft > MaxChunkSize ? MaxChunkSize : ZlibChunkSize_t(inputLeft);
            inputLeft -= zs.avail_in;
        }

        res = processChunk(&zs, inputLeft);
    } while (res == Z_OK);

    switch (res) {
    case Z_STREAM_END:
        out.size -= zs.avail_out;
        Q_ASSERT(size_t(out.size) - initalSize > MaxStatisticsSize || // total_out overflow
                 size_t(out.size) - initalSize == zs.total_out);
        Q_ASSERT(out.size <= out.allocatedCapacity());
        out.data()[out.size] = '\0';
        return QByteArray(std::move(out));

    case Z_MEM_ERROR:
        return tooMuchData(op);

    case Z_BUF_ERROR:
        Q_UNREACHABLE(); // cannot happen - we supply a buffer that can hold the result,
                         // or else error out early

    case Z_DATA_ERROR:   // can only happen on decompression
        Q_ASSERT(op == ZLibOp::Decompression);
        return invalidCompressedData();

    default:
        return unexpectedZlibError(op, res, zs.msg);
    }
}